

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_settings_single_thread::session_settings_single_thread
          (session_settings_single_thread *this)

{
  session_settings_single_thread *this_local;
  
  ::std::
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>::
  array(&this->m_strings);
  ::std::bitset<84UL>::bitset(&this->m_bools);
  initialize_default_settings(this);
  return;
}

Assistant:

session_settings_single_thread::session_settings_single_thread()
	{
		initialize_default_settings(*this);
	}